

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ParseTokenize(void *pContext,int tflags,char *pToken,int nToken,int iUnused1,int iUnused2)

{
  int iVar1;
  Fts5ExprTerm *pOld;
  long lVar2;
  Fts5ExprTerm *__s;
  char *pcVar3;
  int local_78;
  int nNew;
  Fts5ExprPhrase *pNew;
  Fts5ExprTerm *pTerm;
  sqlite3_int64 nByte;
  Fts5ExprTerm *pSyn;
  Fts5ExprPhrase *pPhrase;
  TokenCtx *pCtx;
  int local_38;
  int SZALLOC;
  int rc;
  int iUnused2_local;
  int iUnused1_local;
  int nToken_local;
  char *pToken_local;
  void *pvStack_18;
  int tflags_local;
  void *pContext_local;
  
  local_38 = 0;
  pOld = *pContext;
  if (*(int *)((long)pContext + 8) == 0) {
    iUnused2_local = nToken;
    if (0x8000 < nToken) {
      iUnused2_local = 0x8000;
    }
    SZALLOC = iUnused2;
    rc = iUnused1;
    _iUnused1_local = pToken;
    pToken_local._4_4_ = tflags;
    pvStack_18 = pContext;
    if (((pOld == (Fts5ExprTerm *)0x0) || (*(int *)&pOld->pSynonym < 1)) || ((tflags & 1U) == 0)) {
      if ((pOld == (Fts5ExprTerm *)0x0) || (pSyn = pOld, *(int *)&pOld->pSynonym % 8 == 0)) {
        if (pOld == (Fts5ExprTerm *)0x0) {
          local_78 = 0;
        }
        else {
          local_78 = *(int *)&pOld->pSynonym;
        }
        pSyn = (Fts5ExprTerm *)sqlite3_realloc64(pOld,(long)(local_78 + 8) * 0x20 + 0x40);
        if (pSyn == (Fts5ExprTerm *)0x0) {
          local_38 = 7;
          pSyn = pOld;
        }
        else {
          if (pOld == (Fts5ExprTerm *)0x0) {
            memset(pSyn,0,0x40);
          }
          *(Fts5ExprTerm **)pContext = pSyn;
          *(int *)&pSyn->pSynonym = local_78;
        }
      }
      if (local_38 == 0) {
        iVar1 = *(int *)&pSyn->pSynonym;
        *(int *)&pSyn->pSynonym = iVar1 + 1;
        memset(pSyn + (long)iVar1 + 1,0,0x20);
        pcVar3 = sqlite3Fts5Strndup(&local_38,_iUnused1_local,iUnused2_local);
        pSyn[(long)iVar1 + 1].zTerm = pcVar3;
      }
    }
    else {
      lVar2 = (long)iUnused2_local;
      __s = (Fts5ExprTerm *)sqlite3_malloc64(lVar2 + 0x31U);
      if (__s == (Fts5ExprTerm *)0x0) {
        local_38 = 7;
      }
      else {
        memset(__s,0,lVar2 + 0x31U);
        __s->zTerm = (char *)&__s[1].pIter;
        memcpy(__s->zTerm,_iUnused1_local,(long)iUnused2_local);
        __s->pSynonym = pOld[(long)(*(int *)&pOld->pSynonym + -1) + 1].pSynonym;
        pOld[(long)(*(int *)&pOld->pSynonym + -1) + 1].pSynonym = __s;
      }
    }
    *(int *)((long)pContext + 8) = local_38;
    pContext_local._4_4_ = local_38;
  }
  else {
    pContext_local._4_4_ = *(int *)((long)pContext + 8);
  }
  return pContext_local._4_4_;
}

Assistant:

static int fts5ParseTokenize(
  void *pContext,                 /* Pointer to Fts5InsertCtx object */
  int tflags,                     /* Mask of FTS5_TOKEN_* flags */
  const char *pToken,             /* Buffer containing token */
  int nToken,                     /* Size of token in bytes */
  int iUnused1,                   /* Start offset of token */
  int iUnused2                    /* End offset of token */
){
  int rc = SQLITE_OK;
  const int SZALLOC = 8;
  TokenCtx *pCtx = (TokenCtx*)pContext;
  Fts5ExprPhrase *pPhrase = pCtx->pPhrase;

  UNUSED_PARAM2(iUnused1, iUnused2);

  /* If an error has already occurred, this is a no-op */
  if( pCtx->rc!=SQLITE_OK ) return pCtx->rc;
  if( nToken>FTS5_MAX_TOKEN_SIZE ) nToken = FTS5_MAX_TOKEN_SIZE;

  if( pPhrase && pPhrase->nTerm>0 && (tflags & FTS5_TOKEN_COLOCATED) ){
    Fts5ExprTerm *pSyn;
    sqlite3_int64 nByte = sizeof(Fts5ExprTerm) + sizeof(Fts5Buffer) + nToken+1;
    pSyn = (Fts5ExprTerm*)sqlite3_malloc64(nByte);
    if( pSyn==0 ){
      rc = SQLITE_NOMEM;
    }else{
      memset(pSyn, 0, (size_t)nByte);
      pSyn->zTerm = ((char*)pSyn) + sizeof(Fts5ExprTerm) + sizeof(Fts5Buffer);
      memcpy(pSyn->zTerm, pToken, nToken);
      pSyn->pSynonym = pPhrase->aTerm[pPhrase->nTerm-1].pSynonym;
      pPhrase->aTerm[pPhrase->nTerm-1].pSynonym = pSyn;
    }
  }else{
    Fts5ExprTerm *pTerm;
    if( pPhrase==0 || (pPhrase->nTerm % SZALLOC)==0 ){
      Fts5ExprPhrase *pNew;
      int nNew = SZALLOC + (pPhrase ? pPhrase->nTerm : 0);

      pNew = (Fts5ExprPhrase*)sqlite3_realloc64(pPhrase, 
          sizeof(Fts5ExprPhrase) + sizeof(Fts5ExprTerm) * nNew
      );
      if( pNew==0 ){
        rc = SQLITE_NOMEM;
      }else{
        if( pPhrase==0 ) memset(pNew, 0, sizeof(Fts5ExprPhrase));
        pCtx->pPhrase = pPhrase = pNew;
        pNew->nTerm = nNew - SZALLOC;
      }
    }

    if( rc==SQLITE_OK ){
      pTerm = &pPhrase->aTerm[pPhrase->nTerm++];
      memset(pTerm, 0, sizeof(Fts5ExprTerm));
      pTerm->zTerm = sqlite3Fts5Strndup(&rc, pToken, nToken);
    }
  }

  pCtx->rc = rc;
  return rc;
}